

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O2

ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
* getMemBufferCopyImpl
            (ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
             *__return_storage_ptr__,StringRef InputData,Twine *BufferName)

{
  tuple<llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_> in_RAX;
  error_category *peVar1;
  error_code EC;
  __uniq_ptr_impl<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
  local_28;
  
  local_28._M_t.
  super__Tuple_impl<0UL,_llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_>
  .super__Head_base<0UL,_llvm::WritableMemoryBuffer_*,_false>._M_head_impl =
       (tuple<llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_>)
       (tuple<llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_>)
       in_RAX.
       super__Tuple_impl<0UL,_llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_>
       .super__Head_base<0UL,_llvm::WritableMemoryBuffer_*,_false>._M_head_impl;
  llvm::WritableMemoryBuffer::getNewUninitMemBuffer
            ((WritableMemoryBuffer *)&local_28,InputData.Length,BufferName);
  if ((_Tuple_impl<0UL,_llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_>
       )local_28._M_t.
        super__Tuple_impl<0UL,_llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_>
        .super__Head_base<0UL,_llvm::WritableMemoryBuffer_*,_false>._M_head_impl ==
      (WritableMemoryBuffer *)0x0) {
    peVar1 = (error_category *)std::_V2::generic_category();
    EC._M_cat = peVar1;
    EC._0_8_ = 0xc;
    llvm::
    ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
    ::ErrorOr(__return_storage_ptr__,EC);
  }
  else {
    memcpy(*(_func_int **)
            ((long)local_28._M_t.
                   super__Tuple_impl<0UL,_llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_>
                   .super__Head_base<0UL,_llvm::WritableMemoryBuffer_*,_false>._M_head_impl + 8),
           InputData.Data,InputData.Length);
    llvm::
    ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>>
    ::
    ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>>
              ((ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>>
                *)__return_storage_ptr__,
               (unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>
                *)&local_28,(type *)0x0);
    if (local_28._M_t.
        super__Tuple_impl<0UL,_llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_>
        .super__Head_base<0UL,_llvm::WritableMemoryBuffer_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_>
         )0x0) {
      (**(code **)(*(_func_int **)
                    local_28._M_t.
                    super__Tuple_impl<0UL,_llvm::WritableMemoryBuffer_*,_std::default_delete<llvm::WritableMemoryBuffer>_>
                    .super__Head_base<0UL,_llvm::WritableMemoryBuffer_*,_false>._M_head_impl + 8))()
      ;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static ErrorOr<std::unique_ptr<WritableMemoryBuffer>>
getMemBufferCopyImpl(StringRef InputData, const Twine &BufferName) {
  auto Buf = WritableMemoryBuffer::getNewUninitMemBuffer(InputData.size(), BufferName);
  if (!Buf)
    return make_error_code(errc::not_enough_memory);
  memcpy(Buf->getBufferStart(), InputData.data(), InputData.size());
  return std::move(Buf);
}